

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void IsolatePhiNodes(VmModule *module,VmFunction *function)

{
  SmallArray<VmValue_*,_4U> *this;
  VmBlock *pVVar1;
  VmInstruction *replacement;
  char *pcVar2;
  VmInstruction *pVVar3;
  VmValue **ppVVar4;
  VmValue *pVVar5;
  VmInstruction *pVVar6;
  VmInstruction **ppVVar7;
  uint i;
  uint uVar8;
  VmValue *pVVar9;
  uint k;
  uint uVar10;
  uint index;
  VmBlock *pVVar11;
  VmValue *pVVar12;
  VmValue *pVVar13;
  VmBlock **ppVVar14;
  VmBlock **ppVVar15;
  VmType type;
  VmType type_00;
  VmValue *in_stack_ffffffffffffff10;
  SmallArray<VmInstruction_*,_16U> copyInstructions;
  
  ppVVar14 = &function->firstBlock;
  ppVVar15 = ppVVar14;
  while (pVVar1 = *ppVVar15, pVVar1 != (VmBlock *)0x0) {
    if (pVVar1->firstInstruction != (VmInstruction *)0x0) {
      ppVVar7 = &pVVar1->firstInstruction;
      module->currentBlock = pVVar1;
      pVVar1->insertPoint = pVVar1->lastInstruction->prevSibling;
      pVVar3 = anon_unknown.dwarf_20a43d::CreateInstruction
                         ((anon_unknown_dwarf_20a43d *)module,(VmModule *)0x0,(SynBase *)0x0,
                          (VmType)(ZEXT816(0x51) << 0x40),VM_INST_LOAD_BYTE,(VmValue *)0x0,
                          (VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffff10);
      pVVar1->exitPc = pVVar3;
      while( true ) {
        pVVar3 = *ppVVar7;
        pVVar1->insertPoint = pVVar3;
        if (pVVar3 == (VmInstruction *)0x0) {
          __assert_fail("block->insertPoint",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1aa2,"void IsolatePhiNodes(VmModule *, VmFunction *)");
        }
        if (pVVar3->cmd != VM_INST_PHI) break;
        ppVVar7 = &pVVar3->nextSibling;
      }
      pVVar1->insertPoint = pVVar3->prevSibling;
      pVVar3 = anon_unknown.dwarf_20a43d::CreateInstruction
                         ((anon_unknown_dwarf_20a43d *)module,(VmModule *)0x0,(SynBase *)0x0,
                          (VmType)(ZEXT816(0x51) << 0x40),VM_INST_LOAD_BYTE,(VmValue *)0x0,
                          (VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffff10);
      pVVar1->entryPc = pVVar3;
      pVVar1->insertPoint = pVVar1->lastInstruction;
      module->currentBlock = (VmBlock *)0x0;
    }
    ppVVar15 = &pVVar1->nextSibling;
  }
  do {
    pVVar1 = *ppVVar14;
    if (pVVar1 == (VmBlock *)0x0) {
      return;
    }
    ppVVar7 = &pVVar1->firstInstruction;
    while (pVVar3 = *ppVVar7, pVVar3 != (VmInstruction *)0x0) {
      if (pVVar3->cmd == VM_INST_PHI) {
        this = &pVVar3->arguments;
        uVar8 = (pVVar3->arguments).count;
        uVar10 = 0;
        while (uVar10 < uVar8) {
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,uVar10);
          pVVar13 = *ppVVar4;
          if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 2)) {
            pVVar13 = (VmValue *)0x0;
          }
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,uVar10 | 1);
          pVVar9 = *ppVVar4;
          if ((pVVar9 == (VmValue *)0x0) || (pVVar9->typeID != 3)) {
            pVVar9 = (VmValue *)0x0;
          }
          uVar10 = uVar10 + 2;
          index = uVar10;
          while (uVar8 = (pVVar3->arguments).count, index < uVar8) {
            ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,index);
            pVVar12 = *ppVVar4;
            if ((pVVar12 == (VmValue *)0x0) || (pVVar12->typeID != 2)) {
              pVVar12 = (VmValue *)0x0;
            }
            ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,index + 1);
            pVVar5 = *ppVVar4;
            if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 3)) {
              pVVar5 = (VmValue *)0x0;
            }
            index = index + 2;
            if ((pVVar13 == pVVar12) && (pVVar9 == pVVar5)) {
              __assert_fail("instructionA != instructionB",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1ac0,"void IsolatePhiNodes(VmModule *, VmFunction *)");
            }
          }
        }
        copyInstructions.allocator = module->allocator;
        copyInstructions.data = copyInstructions.little;
        copyInstructions.count = 0;
        copyInstructions.max = 0x10;
        for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 2) {
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,uVar10);
          pVVar13 = *ppVVar4;
          if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 2)) {
            pVVar13 = (VmValue *)0x0;
          }
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,uVar10 + 1);
          pVVar11 = (VmBlock *)*ppVVar4;
          if ((pVVar11 == (VmBlock *)0x0) || ((pVVar11->super_VmValue).typeID != 3)) {
            pVVar11 = (VmBlock *)0x0;
          }
          module->currentBlock = pVVar11;
          pVVar11->insertPoint = pVVar11->exitPc->prevSibling;
          type.structType = (TypeBase *)0x50;
          type._0_8_ = (pVVar13->type).structType;
          pVVar6 = anon_unknown.dwarf_20a43d::CreateInstruction
                             ((anon_unknown_dwarf_20a43d *)module,(VmModule *)0x0,
                              *(SynBase **)&pVVar13->type,type,VM_INST_LOAD_BYTE,(VmValue *)0x0,
                              (VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffff10);
          pcVar2 = (pVVar13->comment).end;
          (pVVar6->super_VmValue).comment.begin = (pVVar13->comment).begin;
          (pVVar6->super_VmValue).comment.end = pcVar2;
          VmInstruction::AddArgument(pVVar11->exitPc,&pVVar6->super_VmValue);
          VmInstruction::AddArgument(pVVar11->exitPc,pVVar13);
          VmValue::AddUse(&pVVar6->super_VmValue,&pVVar3->super_VmValue);
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,uVar10);
          VmValue::RemoveUse(*ppVVar4,&pVVar3->super_VmValue);
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,uVar10);
          *ppVVar4 = &pVVar6->super_VmValue;
          pVVar11->insertPoint = pVVar11->lastInstruction;
          module->currentBlock = (VmBlock *)0x0;
          uVar8 = (pVVar3->arguments).count;
        }
        module->currentBlock = pVVar1;
        pVVar6 = pVVar3;
        while( true ) {
          if (pVVar6 == (VmInstruction *)0x0) {
            pVVar1->insertPoint = (VmInstruction *)0x0;
            __assert_fail("block->insertPoint",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1aee,"void IsolatePhiNodes(VmModule *, VmFunction *)");
          }
          if (pVVar6->cmd != VM_INST_PHI) break;
          pVVar6 = pVVar6->nextSibling;
        }
        pVVar1->insertPoint = pVVar1->entryPc->prevSibling;
        type_00.structType = (TypeBase *)0x50;
        type_00._0_8_ = (pVVar3->super_VmValue).type.structType;
        pVVar6 = anon_unknown.dwarf_20a43d::CreateInstruction
                           ((anon_unknown_dwarf_20a43d *)module,
                            (VmModule *)(pVVar3->super_VmValue).source,
                            *(SynBase **)&(pVVar3->super_VmValue).type,type_00,VM_INST_LOAD_BYTE,
                            (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffff10);
        pcVar2 = (pVVar3->super_VmValue).comment.end;
        (pVVar6->super_VmValue).comment.begin = (pVVar3->super_VmValue).comment.begin;
        (pVVar6->super_VmValue).comment.end = pcVar2;
        VmInstruction::AddArgument(pVVar1->entryPc,&pVVar6->super_VmValue);
        (pVVar3->super_VmValue).canBeRemoved = false;
        anon_unknown.dwarf_20a43d::ReplaceValueUsersWith
                  (module,&pVVar3->super_VmValue,&pVVar6->super_VmValue,(uint *)0x0);
        VmInstruction::AddArgument(pVVar1->entryPc,&pVVar3->super_VmValue);
        (pVVar3->super_VmValue).canBeRemoved = true;
        pVVar1->insertPoint = pVVar1->lastInstruction;
        module->currentBlock = (VmBlock *)0x0;
        for (uVar8 = 0; uVar8 < copyInstructions.count; uVar8 = uVar8 + 1) {
          ppVVar7 = SmallArray<VmInstruction_*,_16U>::operator[](&copyInstructions,uVar8);
          pVVar6 = *ppVVar7;
          pVVar11 = pVVar6->parent;
          while (pVVar11 = pVVar11->idom, pVVar11 != (VmBlock *)0x0) {
            for (uVar10 = 0; uVar10 < copyInstructions.count; uVar10 = uVar10 + 1) {
              if (uVar8 != uVar10) {
                ppVVar7 = SmallArray<VmInstruction_*,_16U>::operator[](&copyInstructions,uVar10);
                replacement = *ppVVar7;
                if ((replacement->super_VmValue).users.count != 0) {
                  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,0);
                  pVVar13 = *ppVVar4;
                  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&replacement->arguments,0);
                  if ((pVVar13 == *ppVVar4) && (replacement->parent == pVVar11)) {
                    anon_unknown.dwarf_20a43d::ReplaceValueUsersWith
                              (module,&pVVar6->super_VmValue,&replacement->super_VmValue,(uint *)0x0
                              );
                    goto LAB_0025a137;
                  }
                }
              }
            }
          }
LAB_0025a137:
        }
        SmallArray<VmInstruction_*,_16U>::~SmallArray(&copyInstructions);
      }
      ppVVar7 = &pVVar3->nextSibling;
    }
    ppVVar14 = &pVVar1->nextSibling;
  } while( true );
}

Assistant:

void IsolatePhiNodes(VmModule *module, VmFunction* function)
{
	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		if(!block->firstInstruction)
			continue;

		// Insert empty parallel copy at the end of a block (before terminator)
		module->currentBlock = block;
		block->insertPoint = block->lastInstruction->prevSibling;

		block->exitPc = CreateInstruction(module, NULL, VmType::Void, VM_INST_PARALLEL_COPY, NULL, NULL, NULL, NULL);

		// Insert empty parallel copy at the start of a block (after phi instructions)
		block->insertPoint = block->firstInstruction;

		while(block->insertPoint && block->insertPoint->cmd == VM_INST_PHI)
			block->insertPoint = block->insertPoint->nextSibling;

		assert(block->insertPoint);

		block->insertPoint = block->insertPoint->prevSibling;

		block->entryPc = CreateInstruction(module, NULL, VmType::Void, VM_INST_PARALLEL_COPY, NULL, NULL, NULL, NULL);

		block->insertPoint = block->lastInstruction;
		module->currentBlock = NULL;
	}

	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst; inst = inst->nextSibling)
		{
			// For each phi node
			if(inst->cmd == VM_INST_PHI)
			{
#if !defined(NDEBUG)
				// Avoid surprises, each edge might introduce only a single variable
				for(unsigned argumentA = 0; argumentA < inst->arguments.size(); argumentA += 2)
				{
					VmInstruction *instructionA = getType<VmInstruction>(inst->arguments[argumentA]);
					VmBlock *edgeA = getType<VmBlock>(inst->arguments[argumentA + 1]);

					for(unsigned argumentB = argumentA + 2; argumentB < inst->arguments.size(); argumentB += 2)
					{
						VmInstruction *instructionB = getType<VmInstruction>(inst->arguments[argumentB]);
						VmBlock *edgeB = getType<VmBlock>(inst->arguments[argumentB + 1]);

						if(edgeA == edgeB)
							assert(instructionA != instructionB);
					}
				}
#endif

				SmallArray<VmInstruction*, 16> copyInstructions(module->allocator);

				// Introduce a copy at the end of the predecessor block
				for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
				{
					VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);
					VmBlock *edge = getType<VmBlock>(inst->arguments[argument + 1]);

					// In a general case if instruction set contains instructions that modify the value after the branch, it won't be valid to insert a copy

					// Place copy before the terminator instruction
					module->currentBlock = edge;
					edge->insertPoint = edge->lastInstruction->prevSibling;

					edge->insertPoint = edge->exitPc->prevSibling;

					VmInstruction *def = CreateInstruction(module, NULL, instruction->type, VM_INST_DEF, NULL, NULL, NULL, NULL);

					def->comment = instruction->comment;

					edge->exitPc->AddArgument(def);
					edge->exitPc->AddArgument(instruction);

					def->AddUse(inst);
					inst->arguments[argument]->RemoveUse(inst);

					inst->arguments[argument] = def;

					edge->insertPoint = edge->lastInstruction;
					module->currentBlock = NULL;
				}

				// In general case if optimization passes create multiple incoming edges from a single block, it won't be valid to insert a copy

				// Introduce a copy right after the phi node
				module->currentBlock = block;
				block->insertPoint = inst;

				while(block->insertPoint && block->insertPoint->cmd == VM_INST_PHI)
					block->insertPoint = block->insertPoint->nextSibling;

				assert(block->insertPoint);

				block->insertPoint = block->insertPoint->prevSibling;

				block->insertPoint = block->entryPc->prevSibling;

				VmInstruction *def = CreateInstruction(module, inst->source, inst->type, VM_INST_DEF, NULL, NULL, NULL, NULL);

				def->comment = inst->comment;

				block->entryPc->AddArgument(def);

				inst->canBeRemoved = false;

				ReplaceValueUsersWith(module, inst, def, NULL);

				block->entryPc->AddArgument(inst);

				inst->canBeRemoved = true;

				block->insertPoint = block->lastInstruction;
				module->currentBlock = NULL;

				// Remove redundant copies
				for(unsigned i = 0; i < copyInstructions.size(); i++)
				{
					VmInstruction *copyA = copyInstructions[i];
					VmBlock *parentA = copyA->parent;

					for(VmBlock *curr = parentA->idom; curr; curr = curr->idom)
					{
						bool replaced = false;

						for(unsigned k = 0; k < copyInstructions.size(); k++)
						{
							if(i == k)
								continue;

							VmInstruction *copyB = copyInstructions[k];

							// Check if already dead
							if(copyB->users.empty())
								continue;

							// Check if the copy is the same
							if(copyA->arguments[0] != copyB->arguments[0])
								continue;

							VmBlock *parentB = copyB->parent;

							// If immediate dominator contains the same copy, use it
							if(parentB == curr)
							{
								ReplaceValueUsersWith(module, copyA, copyB, NULL);
								replaced = true;
								break;
							}
						}

						if(replaced)
							break;
					}
				}
			}
		}
	}
}